

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

ostream * slang::operator<<(ostream *os,SVInt *rhs)

{
  string local_30;
  
  SVInt::toString_abi_cxx11_(&local_30,rhs,0x80,false);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SVInt& rhs) {
    os << rhs.toString();
    return os;
}